

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O3

int fits_get_cwd(char *cwd,int *status)

{
  int iVar1;
  char *pcVar2;
  char buff [1025];
  char acStack_418 [1032];
  
  if (*status != 0) {
    return *status;
  }
  pcVar2 = getcwd(acStack_418,0x401);
  if (pcVar2 == (char *)0x0) {
    *cwd = '\0';
    ffpmsg("Path and file name too long (fits_get_cwd)");
    *status = 0x7d;
    iVar1 = 0x7d;
  }
  else {
    fits_path2url(acStack_418,0x401,cwd,status);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int fits_get_cwd(char *cwd,  /* IO current working directory string */
		 int  *status)
  /*
     retrieve the string containing the current working directory absolute
     path in Unix-like URL standard notation. It is assumed that the CWD
     string has a size of at least FLEN_FILENAME.

     Note that this process is platform dependent. This
     function supports Unix, MSDOS/WIN32, VMS and Macintosh platforms. Each
     platform dependent code segment is conditionally compiled depending 
     upon the setting of the appropriate C preprocesser macros.
   */
{

  char buff[FLEN_FILENAME];


  if(*status != 0) return(*status);

#if defined(macintosh)

  /*
     MacOS case. Currently unknown !!!!
  */

  *buff = 0;

#else
  /*
    Good old getcwd() seems to work with all other platforms
  */

  if (!getcwd(buff,FLEN_FILENAME))
  {
     cwd[0]=0;
     ffpmsg("Path and file name too long (fits_get_cwd)");
     return (*status=URL_PARSE_ERROR);
  }

#endif

  /*
    convert the cwd string to a URL standard path string
  */

  fits_path2url(buff,FLEN_FILENAME,cwd,status);

  return(*status);
}